

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::BaseStatistics::Verify(BaseStatistics *this,Vector *vector,SelectionVector *sel,idx_t count)

{
  StatisticsType SVar1;
  InternalException *pIVar2;
  idx_t iVar3;
  idx_t iVar4;
  UnifiedVectorFormat vdata;
  string local_d8;
  string local_b8;
  string local_98;
  UnifiedVectorFormat local_78;
  
  SVar1 = GetStatsType(&this->type);
  switch(SVar1) {
  case NUMERIC_STATS:
    NumericStats::Verify(this,vector,sel,count);
    break;
  case STRING_STATS:
    StringStats::Verify(this,vector,sel,count);
    break;
  case LIST_STATS:
    ListStats::Verify(this,vector,sel,count);
    break;
  case STRUCT_STATS:
    StructStats::Verify(this,vector,sel,count);
    break;
  case ARRAY_STATS:
    ArrayStats::Verify(this,vector,sel,count);
  }
  if ((this->has_null != true) || (this->has_no_null == false)) {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    if (count != 0) {
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)sel->sel_vector[iVar3];
        }
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(local_78.sel)->sel_vector[iVar4];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6]
             >> (iVar4 & 0x3f) & 1) != 0)) {
          if ((this->has_no_null & 1U) == 0) {
            pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,
                       "Statistics mismatch: vector labeled as having only NULL values, but vector contains valid values: %s"
                       ,"");
            Vector::ToString_abi_cxx11_(&local_98,vector,count);
            InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_d8,&local_98);
            __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else if ((this->has_null & 1U) == 0) {
          pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,
                     "Statistics mismatch: vector labeled as not having NULL values, but vector contains null values: %s"
                     ,"");
          Vector::ToString_abi_cxx11_(&local_b8,vector,count);
          InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_d8,&local_b8);
          __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void BaseStatistics::Verify(Vector &vector, const SelectionVector &sel, idx_t count) const {
	D_ASSERT(vector.GetType() == this->type);
	switch (GetStatsType()) {
	case StatisticsType::NUMERIC_STATS:
		NumericStats::Verify(*this, vector, sel, count);
		break;
	case StatisticsType::STRING_STATS:
		StringStats::Verify(*this, vector, sel, count);
		break;
	case StatisticsType::LIST_STATS:
		ListStats::Verify(*this, vector, sel, count);
		break;
	case StatisticsType::STRUCT_STATS:
		StructStats::Verify(*this, vector, sel, count);
		break;
	case StatisticsType::ARRAY_STATS:
		ArrayStats::Verify(*this, vector, sel, count);
		break;
	default:
		break;
	}
	if (has_null && has_no_null) {
		// nothing to verify
		return;
	}
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		bool row_is_valid = vdata.validity.RowIsValid(index);
		if (row_is_valid && !has_no_null) {
			throw InternalException(
			    "Statistics mismatch: vector labeled as having only NULL values, but vector contains valid values: %s",
			    vector.ToString(count));
		}
		if (!row_is_valid && !has_null) {
			throw InternalException(
			    "Statistics mismatch: vector labeled as not having NULL values, but vector contains null values: %s",
			    vector.ToString(count));
		}
	}
}